

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O2

bool __thiscall
cmAddSubDirectoryCommand::InitialPass
          (cmAddSubDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *psVar1;
  bool bVar2;
  bool excludeFromAll;
  string *psVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string srcPath;
  string binPath;
  string binArg;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string error;
  
  psVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 == psVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,"called with incorrect number of arguments",
               (allocator<char> *)&binArg);
    cmCommand::SetError(&this->super_cmCommand,&error);
    std::__cxx11::string::~string((string *)&error);
    return false;
  }
  binArg._M_dataplus._M_p = (pointer)&binArg.field_2;
  binArg._M_string_length = 0;
  binArg.field_2._M_local_buf[0] = '\0';
  excludeFromAll = false;
  __lhs = psVar3;
  while (__lhs = __lhs + 1, __lhs != psVar1) {
    bVar2 = std::operator==(__lhs,"EXCLUDE_FROM_ALL");
    if (bVar2) {
      excludeFromAll = true;
    }
    else {
      if (binArg._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"called with incorrect number of arguments",
                   (allocator<char> *)&srcPath);
        cmCommand::SetError(&this->super_cmCommand,&error);
        std::__cxx11::string::~string((string *)&error);
        bVar2 = false;
        goto LAB_0016d0c9;
      }
      std::__cxx11::string::_M_assign((string *)&binArg);
    }
  }
  srcPath._M_dataplus._M_p = (pointer)&srcPath.field_2;
  srcPath._M_string_length = 0;
  srcPath.field_2._M_local_buf[0] = '\0';
  bVar2 = cmsys::SystemTools::FileIsFullPath(psVar3);
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)&srcPath);
  }
  else {
    cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::_M_assign((string *)&srcPath);
    std::__cxx11::string::append((char *)&srcPath);
    std::__cxx11::string::append((string *)&srcPath);
  }
  bVar2 = cmsys::SystemTools::FileIsDirectory(&srcPath);
  if (!bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,"given source \"",(allocator<char> *)&binPath);
    std::__cxx11::string::append((string *)&error);
    std::__cxx11::string::append((char *)&error);
    cmCommand::SetError(&this->super_cmCommand,&error);
    std::__cxx11::string::~string((string *)&error);
    bVar2 = false;
    goto LAB_0016d0bf;
  }
  cmsys::SystemTools::CollapseFullPath(&error,&srcPath);
  std::__cxx11::string::operator=((string *)&srcPath,(string *)&error);
  std::__cxx11::string::~string((string *)&error);
  binPath._M_dataplus._M_p = (pointer)&binPath.field_2;
  binPath._M_string_length = 0;
  binPath.field_2._M_local_buf[0] = '\0';
  if (binArg._M_string_length == 0) {
    psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    bVar2 = cmsys::SystemTools::IsSubDirectory(&srcPath,psVar3);
    if (bVar2) {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::substr((ulong)&local_1e8,(ulong)psVar3);
      std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&srcPath);
      std::operator+(&error,&local_1e8,&local_1c8);
      std::__cxx11::string::operator=((string *)&binPath,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      goto LAB_0016d064;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar4 = std::operator<<((ostream *)&error,
                             "not given a binary directory but the given source directory ");
    poVar4 = std::operator<<(poVar4,"\"");
    poVar4 = std::operator<<(poVar4,(string *)&srcPath);
    poVar4 = std::operator<<(poVar4,"\" is not a subdirectory of \"");
    psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"\".  ");
    poVar4 = std::operator<<(poVar4,"When specifying an out-of-tree source a binary directory ");
    std::operator<<(poVar4,"must be explicitly specified.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
    bVar2 = false;
  }
  else {
    bVar2 = cmsys::SystemTools::FileIsFullPath(&binArg);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&binPath);
    }
    else {
      cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::_M_assign((string *)&binPath);
      std::__cxx11::string::append((char *)&binPath);
      std::__cxx11::string::append((string *)&binPath);
    }
LAB_0016d064:
    cmsys::SystemTools::CollapseFullPath(&error,&binPath);
    std::__cxx11::string::operator=((string *)&binPath,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    bVar2 = true;
    cmMakefile::AddSubDirectory
              ((this->super_cmCommand).Makefile,&srcPath,&binPath,excludeFromAll,true);
  }
  std::__cxx11::string::~string((string *)&binPath);
LAB_0016d0bf:
  std::__cxx11::string::~string((string *)&srcPath);
LAB_0016d0c9:
  std::__cxx11::string::~string((string *)&binArg);
  return bVar2;
}

Assistant:

bool cmAddSubDirectoryCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // store the binpath
  std::string const& srcArg = args.front();
  std::string binArg;

  bool excludeFromAll = false;

  // process the rest of the arguments looking for optional args
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = arg;
    } else {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg)) {
    srcPath = srcArg;
  } else {
    srcPath = this->Makefile->GetCurrentSourceDirectory();
    srcPath += "/";
    srcPath += srcArg;
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = "given source \"";
    error += srcArg;
    error += "\" which is not an existing directory.";
    this->SetError(error);
    return false;
  }
  srcPath = cmSystemTools::CollapseFullPath(srcPath);

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(
          srcPath, this->Makefile->GetCurrentSourceDirectory())) {
      std::ostringstream e;
      e << "not given a binary directory but the given source directory "
        << "\"" << srcPath << "\" is not a subdirectory of \""
        << this->Makefile->GetCurrentSourceDirectory() << "\".  "
        << "When specifying an out-of-tree source a binary directory "
        << "must be explicitly specified.";
      this->SetError(e.str());
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const std::string& src = this->Makefile->GetCurrentSourceDirectory();
    const std::string& bin = this->Makefile->GetCurrentBinaryDirectory();
    size_t srcLen = src.length();
    size_t binLen = bin.length();
    if (srcLen > 0 && src.back() == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin.back() == '/') {
      --binLen;
    }
    binPath = bin.substr(0, binLen) + srcPath.substr(srcLen);
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg)) {
      binPath = binArg;
    } else {
      binPath = this->Makefile->GetCurrentBinaryDirectory();
      binPath += "/";
      binPath += binArg;
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, true);

  return true;
}